

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

void __thiscall fmt::v5::formatter<tm,_char,_void>::formatter(formatter<tm,_char,_void> *this)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_RDI;
  allocator<char> *in_stack_ffffffffffffffc8;
  allocator<char> local_9 [9];
  
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_RDI,in_stack_ffffffffffffffc8);
  std::allocator<char>::~allocator(local_9);
  return;
}

Assistant:

auto parse(ParseContext &ctx) -> decltype(ctx.begin()) {
    auto it = ctx.begin();
    if (it != ctx.end() && *it == ':')
      ++it;
    auto end = it;
    while (end != ctx.end() && *end != '}')
      ++end;
    tm_format.reserve(internal::to_unsigned(end - it + 1));
    tm_format.append(it, end);
    tm_format.push_back('\0');
    return end;
  }